

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ram_test.cc
# Opt level: O0

int test_create_group(void)

{
  code *pcVar1;
  char *__s;
  RamCreateGroupRequestType *pRVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_189;
  int ret;
  HttpTestListener *local_168;
  HttpTestListener *listener;
  string local_158;
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [55];
  allocator<char> local_d1;
  string local_d0 [32];
  RamCreateGroupRequestType *local_b0;
  Ram *ram;
  RamCreateGroupResponseType resp;
  RamCreateGroupRequestType req;
  
  aliyun::RamCreateGroupRequestType::RamCreateGroupRequestType
            ((RamCreateGroupRequestType *)((long)&resp.group.create_date.field_2 + 8));
  aliyun::RamCreateGroupResponseType::RamCreateGroupResponseType((RamCreateGroupResponseType *)&ram)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"cn-hangzhou",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"my_appid",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"my_secret",&local_131);
  pRVar2 = (RamCreateGroupRequestType *)aliyun::Ram::CreateRamClient(local_d0,local_108,local_130);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  local_b0 = pRVar2;
  if (pRVar2 == (RamCreateGroupRequestType *)0x0) {
    aliyun::RamCreateGroupResponseType::~RamCreateGroupResponseType
              ((RamCreateGroupResponseType *)&ram);
    aliyun::RamCreateGroupRequestType::~RamCreateGroupRequestType
              ((RamCreateGroupRequestType *)((long)&resp.group.create_date.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ram::SetProxyHost((Ram *)pRVar2,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ram::SetUseTls((Ram *)local_b0,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_create_group_response;
  local_168 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_189);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_189);
  HttpTestListener::Start(local_168);
  std::__cxx11::string::operator=
            ((string *)(resp.group.create_date.field_2._M_local_buf + 8),"GroupName");
  std::__cxx11::string::operator=((string *)(req.group_name.field_2._M_local_buf + 8),"Comments");
  aliyun::Ram::CreateGroup
            (local_b0,(RamCreateGroupResponseType *)((long)&resp.group.create_date.field_2 + 8),
             (RamErrorInfo *)&ram);
  HttpTestListener::WaitComplete(local_168);
  pHVar3 = local_168;
  if (local_168 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_168);
    operator_delete(pHVar3,0x180);
  }
  pRVar2 = local_b0;
  if (local_b0 != (RamCreateGroupRequestType *)0x0) {
    aliyun::Ram::~Ram((Ram *)local_b0);
    operator_delete(pRVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_create_group() {
  RamCreateGroupRequestType req;
  RamCreateGroupResponseType resp;
  Ram* ram = Ram::CreateRamClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ram) return 0;
  ram->SetProxyHost("127.0.0.1:12234");
  ram->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_create_group_response);
  listener->Start();
  req.group_name = "GroupName";
  req.comments = "Comments";
  int ret = ram->CreateGroup(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ram;
}